

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

void __thiscall
SimpleString::split(SimpleString *this,SimpleString *delimiter,SimpleStringCollection *col)

{
  bool bVar1;
  SimpleString *pSVar2;
  SimpleString *in_RDI;
  SimpleStringCollection *unaff_retaddr;
  size_t i;
  char *prev;
  char *str;
  size_t extraEndToken;
  size_t num;
  SimpleString *in_stack_ffffffffffffff78;
  SimpleString *in_stack_ffffffffffffff80;
  SimpleString *in_stack_ffffffffffffff88;
  SimpleString *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  SimpleStringCollection *in_stack_ffffffffffffffa8;
  SimpleString local_50 [2];
  ulong local_40;
  char *local_38;
  char *local_30;
  ulong local_28;
  size_t local_20;
  
  pSVar2 = in_RDI;
  local_20 = count(in_RDI,in_stack_ffffffffffffff88);
  bVar1 = endsWith(in_stack_ffffffffffffff98,in_RDI);
  local_28 = (ulong)!bVar1;
  SimpleStringCollection::allocate(unaff_retaddr,(size_t)pSVar2);
  local_30 = in_RDI->buffer_;
  for (local_40 = 0; local_40 < local_20; local_40 = local_40 + 1) {
    local_38 = local_30;
    local_30 = StrStr((char *)in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80);
    local_30 = local_30 + 1;
    in_stack_ffffffffffffff88 = local_50;
    SimpleString(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
    subString((SimpleString *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
              (size_t)in_stack_ffffffffffffff98);
    in_stack_ffffffffffffff80 =
         SimpleStringCollection::operator[](in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    ~SimpleString((SimpleString *)0x20ac5f);
    ~SimpleString((SimpleString *)0x20ac69);
  }
  if (local_28 != 0) {
    SimpleString(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
    pSVar2 = SimpleStringCollection::operator[](in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0)
    ;
    operator=(in_stack_ffffffffffffff80,pSVar2);
    ~SimpleString((SimpleString *)0x20acf6);
  }
  return;
}

Assistant:

void SimpleString::split(const SimpleString& delimiter, SimpleStringCollection& col) const
{
    size_t num = count(delimiter);
    size_t extraEndToken = (endsWith(delimiter)) ? 0 : 1U;
    col.allocate(num + extraEndToken);

    char* str = buffer_;
    char* prev;
    for (size_t i = 0; i < num; ++i) {
        prev = str;
        str = StrStr(str, delimiter.buffer_) + 1;
        col[i] = SimpleString(prev).subString(0, size_t (str - prev));
    }
    if (extraEndToken) {
        col[num] = str;
    }
}